

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::Run(Thread *this,int num_instructions,Ptr *out_trap)

{
  Store *store;
  reference pvVar1;
  RunResult result;
  undefined1 local_40 [8];
  Ptr func;
  Ptr *out_trap_local;
  int num_instructions_local;
  Thread *this_local;
  
  store = this->store_;
  func.root_index_ = (Index)out_trap;
  pvVar1 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                     (&this->frames_);
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)local_40,store,(Ref)(pvVar1->func).index);
  for (out_trap_local._4_4_ = num_instructions; 0 < out_trap_local._4_4_;
      out_trap_local._4_4_ = out_trap_local._4_4_ + -1) {
    this_local._4_4_ = StepInternal(this,(Ptr *)func.root_index_);
    if (this_local._4_4_ != Ok) goto LAB_001729f6;
  }
  this_local._4_4_ = Ok;
LAB_001729f6:
  RefPtr<wabt::interp::DefinedFunc>::~RefPtr((RefPtr<wabt::interp::DefinedFunc> *)local_40);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::Run(int num_instructions, Trap::Ptr* out_trap) {
  DefinedFunc::Ptr func{store_, frames_.back().func};
  for (; num_instructions > 0; --num_instructions) {
    auto result = StepInternal(out_trap);
    if (result != RunResult::Ok) {
      return result;
    }
  }
  return RunResult::Ok;
}